

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad.c
# Opt level: O2

uint highbd_sadb(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  lVar5 = (long)a8 * 2;
  lVar3 = (long)b8 * 2;
  uVar7 = 0;
  uVar6 = (ulong)(uint)width;
  if (width < 1) {
    uVar6 = uVar7;
  }
  if (height < 1) {
    height = 0;
  }
  uVar2 = 0;
  for (; (int)uVar7 != height; uVar7 = (ulong)((int)uVar7 + 1)) {
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      uVar4 = (uint)*(ushort *)(lVar5 + uVar8 * 2) - (uint)*(ushort *)(lVar3 + uVar8 * 2);
      uVar1 = -uVar4;
      if (0 < (int)uVar4) {
        uVar1 = uVar4;
      }
      uVar2 = uVar2 + (uVar1 & 0xffff);
    }
    lVar3 = lVar3 + (ulong)(uint)b_stride * 2;
    lVar5 = lVar5 + (long)a_stride * 2;
  }
  return uVar2;
}

Assistant:

static inline unsigned int highbd_sadb(const uint8_t *a8, int a_stride,
                                       const uint8_t *b8, int b_stride,
                                       int width, int height) {
  int y, x;
  unsigned int sad = 0;
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      sad += abs(a[x] - b[x]);
    }

    a += a_stride;
    b += b_stride;
  }
  return sad;
}